

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

void __thiscall ODDLParser::Value::setString(Value *this,string *str)

{
  if (this->m_type == ddl_string) {
    memcpy(this->m_data,(str->_M_dataplus)._M_p,str->_M_string_length);
    this->m_data[str->_M_string_length] = '\0';
    return;
  }
  __assert_fail("ddl_string == m_type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/openddlparser/code/Value.cpp"
                ,0x10a,"void ODDLParser::Value::setString(const std::string &)");
}

Assistant:

void Value::setString( const std::string &str ) {
    assert( ddl_string == m_type );
    ::memcpy( m_data, str.c_str(), str.size() );
    m_data[ str.size() ] = '\0';
}